

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsBrokerSendOrderedCommand(HelicsBroker broker,char *target,char *command,HelicsError *err)

{
  Broker *pBVar1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  
  pBVar1 = getBroker(broker,err);
  if (pBVar1 == (Broker *)0x0) {
    return;
  }
  sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
  if (target != (char *)0x0) {
    sVar2 = strlen(target);
    _Var5._M_p = target;
  }
  sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (command != (char *)0x0) {
    sVar3 = strlen(command);
    _Var4._M_p = command;
  }
  (*pBVar1->_vptr_Broker[0x13])(pBVar1,sVar2,_Var5._M_p,sVar3,_Var4._M_p,1);
  return;
}

Assistant:

void helicsBrokerSendOrderedCommand(HelicsBroker broker, const char* target, const char* command, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    brk->sendCommand(AS_STRING_VIEW(target), AS_STRING_VIEW(command), HELICS_SEQUENCING_MODE_ORDERED);
}